

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_thread.cpp
# Opt level: O3

CPalThread * AllocTHREAD(void)

{
  Volatile<CorUnix::CPalThread_*> this;
  CPalThread *pCVar1;
  
  CCLock::Enter(&free_threads_spinlock);
  this = free_threads_list;
  if (free_threads_list.m_val != (CPalThread *)0x0) {
    free_threads_list.m_val = (free_threads_list.m_val)->m_pNext;
    CCLock::Leave(&free_threads_spinlock);
    CorUnix::CPalThread::CPalThread(this.m_val);
    return this.m_val;
  }
  CCLock::Leave(&free_threads_spinlock);
  pCVar1 = CorUnix::InternalNew<CorUnix::CPalThread>();
  return pCVar1;
}

Assistant:

CPalThread* AllocTHREAD()
{
    CPalThread* pThread = NULL;

    free_threads_spinlock.Enter();

    pThread = free_threads_list;
    if (pThread != NULL)
    {
        free_threads_list = pThread->GetNext();
    }

    free_threads_spinlock.Leave();

    if (pThread == NULL)
    {
        pThread = InternalNew<CPalThread>();
    }
    else
    {
        pThread = new (pThread) CPalThread;
    }

    return pThread;
}